

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O2

fstream * __thiscall
SharedDirectory::open_readable_file
          (fstream *__return_storage_ptr__,SharedDirectory *this,string *name)

{
  bool bVar1;
  Error *this_00;
  path local_60;
  string local_40;
  
  bVar1 = can_read_file(this,name);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)name);
    path_in_dir(&local_60,this,&local_40);
    boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
              (__return_storage_ptr__,&local_60,_S_in);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"File does not exist");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

boost::filesystem::fstream SharedDirectory::open_readable_file(const std::string &name) {
  if (!can_read_file(name)) {
    throw Error("File does not exist");
  }
  return fstream(path_in_dir(name), std::ios::in);
}